

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_enc.c
# Opt level: O3

int VP8EmitTokens(VP8TBuffer *b,VP8BitWriter *bw,uint8_t *probas,int final_pass)

{
  ushort uVar1;
  VP8Tokens *pVVar2;
  VP8Tokens *ptr;
  int iVar3;
  uint prob;
  long lVar4;
  
  pVVar2 = b->pages_;
  while (ptr = pVVar2, ptr != (VP8Tokens *)0x0) {
    pVVar2 = ptr->next_;
    iVar3 = 0;
    if (pVVar2 == (VP8Tokens *)0x0) {
      iVar3 = b->left_;
    }
    lVar4 = (long)b->page_size_;
    if (iVar3 < b->page_size_) {
      do {
        uVar1 = *(ushort *)((long)&ptr->next_ + lVar4 * 2 + 6);
        if ((uVar1 >> 0xe & 1) == 0) {
          prob = (uint)probas[uVar1 & 0x3fff];
        }
        else {
          prob = uVar1 & 0xff;
        }
        lVar4 = lVar4 + -1;
        VP8PutBit(bw,(uint)(uVar1 >> 0xf),prob);
      } while (iVar3 < lVar4);
    }
    if (final_pass != 0) {
      WebPSafeFree(ptr);
    }
  }
  if (final_pass != 0) {
    b->pages_ = (VP8Tokens *)0x0;
  }
  return 1;
}

Assistant:

int VP8EmitTokens(VP8TBuffer* const b, VP8BitWriter* const bw,
                  const uint8_t* const probas, int final_pass) {
  const VP8Tokens* p = b->pages_;
  assert(!b->error_);
  while (p != NULL) {
    const VP8Tokens* const next = p->next_;
    const int N = (next == NULL) ? b->left_ : 0;
    int n = b->page_size_;
    const token_t* const tokens = TOKEN_DATA(p);
    while (n-- > N) {
      const token_t token = tokens[n];
      const int bit = (token >> 15) & 1;
      if (token & FIXED_PROBA_BIT) {
        VP8PutBit(bw, bit, token & 0xffu);  // constant proba
      } else {
        VP8PutBit(bw, bit, probas[token & 0x3fffu]);
      }
    }
    if (final_pass) WebPSafeFree((void*)p);
    p = next;
  }
  if (final_pass) b->pages_ = NULL;
  return 1;
}